

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O3

void __thiscall SigHashTest::RandomScript(SigHashTest *this,CScript *script)

{
  long lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x1c < (script->super_CScriptBase)._size) {
    free((script->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(undefined8 *)((long)&(script->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(script->super_CScriptBase)._union + 0x18) = 0;
  (script->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(script->super_CScriptBase)._union + 8) = 0;
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  do {
    uVar2 = RandomMixin<FastRandomContext>::randbits
                      (&this_00->super_RandomMixin<FastRandomContext>,4);
  } while (9 < uVar2);
  if (uVar2 != 0) {
    iVar4 = 0;
    do {
      do {
        uVar3 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,4);
      } while (8 < uVar3);
      CScript::operator<<(script,RandomScript::oplist[uVar3]);
      iVar4 = iVar4 + 1;
    } while (iVar4 != (int)uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RandomScript(CScript &script) {
    static const opcodetype oplist[] = {OP_FALSE, OP_1, OP_2, OP_3, OP_CHECKSIG, OP_IF, OP_VERIF, OP_RETURN, OP_CODESEPARATOR};
    script = CScript();
    int ops = (m_rng.randrange(10));
    for (int i=0; i<ops; i++)
        script << oplist[m_rng.randrange(std::size(oplist))];
}